

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DPIExportSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DPIExportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,Token *args_6,
          Token *args_7)

{
  Token keyword;
  Token specString;
  Token c_identifier;
  Token equals;
  Token functionOrTask;
  Token name;
  Token semi;
  DPIExportSyntax *this_00;
  Token *args_local_4;
  Token *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_local;
  BumpAllocator *this_local;
  
  this_00 = (DPIExportSyntax *)allocate(this,0xb0,8);
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  specString.kind = args_2->kind;
  specString._2_1_ = args_2->field_0x2;
  specString.numFlags.raw = (args_2->numFlags).raw;
  specString.rawLen = args_2->rawLen;
  specString.info = args_2->info;
  c_identifier.kind = args_3->kind;
  c_identifier._2_1_ = args_3->field_0x2;
  c_identifier.numFlags.raw = (args_3->numFlags).raw;
  c_identifier.rawLen = args_3->rawLen;
  c_identifier.info = args_3->info;
  equals.kind = args_4->kind;
  equals._2_1_ = args_4->field_0x2;
  equals.numFlags.raw = (args_4->numFlags).raw;
  equals.rawLen = args_4->rawLen;
  equals.info = args_4->info;
  functionOrTask.kind = args_5->kind;
  functionOrTask._2_1_ = args_5->field_0x2;
  functionOrTask.numFlags.raw = (args_5->numFlags).raw;
  functionOrTask.rawLen = args_5->rawLen;
  functionOrTask.info = args_5->info;
  name.kind = args_6->kind;
  name._2_1_ = args_6->field_0x2;
  name.numFlags.raw = (args_6->numFlags).raw;
  name.rawLen = args_6->rawLen;
  name.info = args_6->info;
  semi.kind = args_7->kind;
  semi._2_1_ = args_7->field_0x2;
  semi.numFlags.raw = (args_7->numFlags).raw;
  semi.rawLen = args_7->rawLen;
  semi.info = args_7->info;
  slang::syntax::DPIExportSyntax::DPIExportSyntax
            (this_00,args,keyword,specString,c_identifier,equals,functionOrTask,name,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }